

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * util::fmt_abi_cxx11_(string *__return_storage_ptr__,char *fmt,...)

{
  char in_AL;
  int iVar1;
  reference __s;
  size_type __maxlen;
  char *pcVar2;
  ulong uVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  allocator local_6d [20];
  allocator_type local_59;
  undefined1 local_58 [8];
  vector<char,_std::allocator<char>_> bytes;
  undefined4 local_38;
  int len;
  va_list args;
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_128;
  args[0]._0_8_ = &stack0x00000008;
  len = 0x30;
  local_38 = 0x10;
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
       vsnprintf((char *)0x0,0,fmt,&local_38);
  iVar1 = bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_58,(long)iVar1,&local_59);
  std::allocator<char>::~allocator(&local_59);
  args[0].overflow_arg_area = local_128;
  args[0]._0_8_ = &stack0x00000008;
  len = 0x30;
  local_38 = 0x10;
  __s = std::vector<char,_std::allocator<char>_>::operator[]
                  ((vector<char,_std::allocator<char>_> *)local_58,0);
  __maxlen = std::vector<char,_std::allocator<char>_>::size
                       ((vector<char,_std::allocator<char>_> *)local_58);
  vsnprintf(__s,__maxlen,fmt,&local_38);
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)local_58);
  uVar3 = (ulong)(int)bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,uVar3,local_6d);
  std::allocator<char>::~allocator((allocator<char> *)local_6d);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_58)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string fmt(const char* fmt, ...)
{
    va_list args;
    va_start(args, fmt);
    auto len = std::vsnprintf(nullptr, 0, fmt, args);
    va_end(args);

    std::vector<char> bytes(len + 1); // +1 for \0

    va_start(args, fmt);
    std::vsnprintf(&bytes[0], bytes.size(), fmt, args);
    va_end(args);

    return std::string(bytes.data(), len);
}